

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

void MRIStepFree(void **arkode_mem)

{
  long lVar1;
  N_Vector **in_RDI;
  int unaff_retaddr;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  sunindextype Clrw;
  sunindextype Cliw;
  SUNNonlinearSolver in_stack_ffffffffffffffd8;
  ARKodeMem in_stack_ffffffffffffffe0;
  N_Vector *lrw;
  int local_10;
  sunindextype in_stack_fffffffffffffff4;
  
  if (*in_RDI != (N_Vector *)0x0) {
    lrw = *in_RDI;
    if (lrw[0x1d] != (N_Vector)0x0) {
      in_stack_ffffffffffffffe0 = (ARKodeMem)lrw[0x1d];
      if (*(long *)&in_stack_ffffffffffffffe0->atolmin0 != 0) {
        MRIStepCoupling_Space
                  (*(MRIStepCoupling *)&in_stack_ffffffffffffffe0->atolmin0,
                   (sunindextype *)&stack0xfffffffffffffff4,&local_10);
        MRIStepCoupling_Free((MRIStepCoupling)in_stack_ffffffffffffffe0);
        *(undefined8 *)&in_stack_ffffffffffffffe0->atolmin0 = 0;
        lrw[0x44] = (N_Vector)((long)lrw[0x44] - (long)in_stack_fffffffffffffff4);
        lrw[0x43] = (N_Vector)((long)lrw[0x43] - (long)local_10);
        if (in_stack_ffffffffffffffe0->efun != (ARKEwtFn)0x0) {
          free(in_stack_ffffffffffffffe0->efun);
          in_stack_ffffffffffffffe0->efun = (ARKEwtFn)0x0;
          lrw[0x44] = (N_Vector)
                      ((long)lrw[0x44] - (long)*(int *)&in_stack_ffffffffffffffe0->VRabstol);
        }
        lVar1._0_4_ = in_stack_ffffffffffffffe0->Ratolmin0;
        lVar1._4_4_ = in_stack_ffffffffffffffe0->user_efun;
        if (lVar1 != 0) {
          free(*(void **)&in_stack_ffffffffffffffe0->Ratolmin0);
          in_stack_ffffffffffffffe0->Ratolmin0 = 0;
          in_stack_ffffffffffffffe0->user_efun = 0;
          lrw[0x44] = (N_Vector)
                      ((long)lrw[0x44] - (long)*(int *)&in_stack_ffffffffffffffe0->VRabstol);
        }
        if (in_stack_ffffffffffffffe0->e_data != (void *)0x0) {
          free(in_stack_ffffffffffffffe0->e_data);
          in_stack_ffffffffffffffe0->e_data = (void *)0x0;
          lrw[0x43] = (N_Vector)
                      ((long)lrw[0x43] - (long)*(int *)&in_stack_ffffffffffffffe0->VRabstol);
        }
        if (*(long *)&in_stack_ffffffffffffffe0->user_rfun != 0) {
          free(*(void **)&in_stack_ffffffffffffffe0->user_rfun);
          *(undefined8 *)&in_stack_ffffffffffffffe0->user_rfun = 0;
          lrw[0x43] = (N_Vector)
                      ((long)lrw[0x43] - (long)*(int *)&in_stack_ffffffffffffffe0->VRabstol);
        }
      }
      if ((in_stack_ffffffffffffffe0->step_attachmasssol != (ARKTimestepAttachMasssolFn)0x0) &&
         (*(int *)&in_stack_ffffffffffffffe0->step_disablelsetup != 0)) {
        SUNNonlinSolFree(in_stack_ffffffffffffffd8);
        *(undefined4 *)&in_stack_ffffffffffffffe0->step_disablelsetup = 0;
      }
      in_stack_ffffffffffffffe0->step_attachmasssol = (ARKTimestepAttachMasssolFn)0x0;
      if (in_stack_ffffffffffffffe0->constraints != (N_Vector)0x0) {
        (*(code *)in_stack_ffffffffffffffe0->constraints)(lrw);
        in_stack_ffffffffffffffe0->interp = (ARKInterp)0x0;
      }
      if (in_stack_ffffffffffffffe0->rfun != (ARKRwtFn)0x0) {
        arkFreeVec(in_stack_ffffffffffffffe0,(N_Vector *)in_stack_ffffffffffffffd8);
        in_stack_ffffffffffffffe0->rfun = (ARKRwtFn)0x0;
      }
      if (in_stack_ffffffffffffffe0->r_data != (void *)0x0) {
        arkFreeVec(in_stack_ffffffffffffffe0,(N_Vector *)in_stack_ffffffffffffffd8);
        in_stack_ffffffffffffffe0->r_data = (void *)0x0;
      }
      if (*(long *)&in_stack_ffffffffffffffe0->constraintsSet != 0) {
        arkFreeVec(in_stack_ffffffffffffffe0,(N_Vector *)in_stack_ffffffffffffffd8);
        *(undefined8 *)&in_stack_ffffffffffffffe0->constraintsSet = 0;
      }
      if (in_stack_ffffffffffffffe0->Sabstol != 0.0) {
        arkFreeVecArray(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4,(long *)lrw,
                        (sunindextype)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                        (long *)in_stack_ffffffffffffffd8);
      }
      if (in_stack_ffffffffffffffe0->Vabstol != (N_Vector)0x0) {
        arkFreeVecArray(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4,(long *)lrw,
                        (sunindextype)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                        (long *)in_stack_ffffffffffffffd8);
      }
      if (in_stack_ffffffffffffffe0->tcur != 0.0) {
        free((void *)in_stack_ffffffffffffffe0->tcur);
        in_stack_ffffffffffffffe0->tcur = 0.0;
        lrw[0x43] = (N_Vector)((long)lrw[0x43] - (long)*(int *)&in_stack_ffffffffffffffe0->eta);
      }
      if (in_stack_ffffffffffffffe0->tretlast != 0.0) {
        free((void *)in_stack_ffffffffffffffe0->tretlast);
        in_stack_ffffffffffffffe0->tretlast = 0.0;
        lrw[0x44] = (N_Vector)((long)lrw[0x44] - (long)*(int *)&in_stack_ffffffffffffffe0->eta);
      }
      *(undefined4 *)&in_stack_ffffffffffffffe0->eta = 0;
      free(lrw[0x1d]);
      lrw[0x1d] = (N_Vector)0x0;
    }
    arkFree(&in_stack_ffffffffffffffe0->sunctx);
  }
  return;
}

Assistant:

void MRIStepFree(void **arkode_mem)
{
  sunindextype Cliw, Clrw;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;

  /* nothing to do if arkode_mem is already NULL */
  if (*arkode_mem == NULL)  return;

  /* conditional frees on non-NULL MRIStep module */
  ark_mem = (ARKodeMem) (*arkode_mem);
  if (ark_mem->step_mem != NULL) {

    step_mem = (ARKodeMRIStepMem) ark_mem->step_mem;

    /* free the coupling structure and derived quantities */
    if (step_mem->MRIC != NULL) {
      MRIStepCoupling_Space(step_mem->MRIC, &Cliw, &Clrw);
      MRIStepCoupling_Free(step_mem->MRIC);
      step_mem->MRIC = NULL;
      ark_mem->liw -= Cliw;
      ark_mem->lrw -= Clrw;
      if (step_mem->stagetypes) {
        free(step_mem->stagetypes);
        step_mem->stagetypes = NULL;
        ark_mem->liw -= step_mem->stages;
      }
      if (step_mem->stage_map) {
        free(step_mem->stage_map);
        step_mem->stage_map = NULL;
        ark_mem->liw -= step_mem->stages;
      }
      if (step_mem->Ae_row) {
        free(step_mem->Ae_row);
        step_mem->Ae_row = NULL;
        ark_mem->lrw -= step_mem->stages;
      }
      if (step_mem->Ai_row) {
        free(step_mem->Ai_row);
        step_mem->Ai_row = NULL;
        ark_mem->lrw -= step_mem->stages;
      }
    }

    /* free the nonlinear solver memory (if applicable) */
    if ((step_mem->NLS != NULL) && (step_mem->ownNLS)) {
      SUNNonlinSolFree(step_mem->NLS);
      step_mem->ownNLS = SUNFALSE;
    }
    step_mem->NLS = NULL;

    /* free the linear solver memory */
    if (step_mem->lfree != NULL) {
      step_mem->lfree((void *) ark_mem);
      step_mem->lmem = NULL;
    }

    /* free the sdata, zpred and zcor vectors */
    if (step_mem->sdata != NULL) {
      arkFreeVec(ark_mem, &step_mem->sdata);
      step_mem->sdata = NULL;
    }
    if (step_mem->zpred != NULL) {
      arkFreeVec(ark_mem, &step_mem->zpred);
      step_mem->zpred = NULL;
    }
    if (step_mem->zcor != NULL) {
      arkFreeVec(ark_mem, &step_mem->zcor);
      step_mem->zcor = NULL;
    }

    /* free the RHS vectors */
    if (step_mem->Fse) {
      arkFreeVecArray(step_mem->nstages_stored, &(step_mem->Fse),
                      ark_mem->lrw1, &(ark_mem->lrw),
                      ark_mem->liw1, &(ark_mem->liw));
    }

    if (step_mem->Fsi) {
      arkFreeVecArray(step_mem->nstages_stored, &(step_mem->Fsi),
                      ark_mem->lrw1, &(ark_mem->lrw),
                      ark_mem->liw1, &(ark_mem->liw));
    }

    /* free the reusable arrays for fused vector interface */
    if (step_mem->cvals != NULL) {
      free(step_mem->cvals);
      step_mem->cvals = NULL;
      ark_mem->lrw -= (step_mem->nfusedopvecs);
    }
    if (step_mem->Xvecs != NULL) {
      free(step_mem->Xvecs);
      step_mem->Xvecs = NULL;
      ark_mem->liw -= (step_mem->nfusedopvecs);
    }
    step_mem->nfusedopvecs = 0;

    /* free the time stepper module itself */
    free(ark_mem->step_mem);
    ark_mem->step_mem = NULL;
  }

  /* free memory for overall ARKode infrastructure */
  arkFree(arkode_mem);
}